

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O0

void blake224_hash(uint8_t *out,uint8_t *in,uint64_t inlen)

{
  state_conflict S;
  uint8_t *in_stack_ffffffffffffff68;
  state_conflict *in_stack_ffffffffffffff70;
  
  blake224_init((state_conflict *)&stack0xffffffffffffff68);
  blake224_update(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x2478a3);
  blake224_final(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void blake224_hash(uint8_t *out, const uint8_t *in, uint64_t inlen) {
    state S;
    blake224_init(&S);
    blake224_update(&S, in, inlen * 8);
    blake224_final(&S, out);
}